

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

abctime Saig_ManBmcTimeToStop(Saig_ParBmc_t *pPars,abctime nTimeToStopNG)

{
  int iVar1;
  int iVar2;
  long lVar3;
  timespec ts;
  timespec local_20;
  
  iVar1 = pPars->nTimeOutGap;
  if ((long)iVar1 == 0) {
    lVar3 = 0;
  }
  else {
    iVar2 = clock_gettime(3,&local_20);
    if (iVar2 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
    }
    lVar3 = lVar3 + (long)iVar1 * 1000000;
    if ((nTimeToStopNG != 0) && (lVar3 != 0)) {
      if (lVar3 < nTimeToStopNG) {
        return lVar3;
      }
      return nTimeToStopNG;
    }
  }
  if (nTimeToStopNG != 0) {
    lVar3 = nTimeToStopNG;
  }
  return lVar3;
}

Assistant:

abctime Saig_ManBmcTimeToStop( Saig_ParBmc_t * pPars, abctime nTimeToStopNG )
{
    abctime nTimeToStopGap = pPars->nTimeOutGap ? pPars->nTimeOutGap * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime nTimeToStop = 0;
    if ( nTimeToStopNG && nTimeToStopGap )
        nTimeToStop = nTimeToStopNG < nTimeToStopGap ? nTimeToStopNG : nTimeToStopGap;
    else if ( nTimeToStopNG )
        nTimeToStop = nTimeToStopNG;
    else if ( nTimeToStopGap )
        nTimeToStop = nTimeToStopGap;
    return nTimeToStop;
}